

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall QSyntaxHighlighterPrivate::applyFormatChanges(QSyntaxHighlighterPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  QTextBlock *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int preeditAreaLength;
  int preeditAreaStart;
  QTextLayout *layout;
  bool formatsChanged;
  anon_class_8_2_b718747f_for__M_pred isOutsidePreeditArea;
  QList<QTextLayout::FormatRange> ranges;
  FormatRange r;
  parameter_type in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  anon_class_8_2_b718747f_for__M_pred in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  bool local_a1;
  int local_88;
  int local_84;
  bool local_69;
  QString local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextBlock::layout((QTextBlock *)in_stack_ffffffffffffff38);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::formats((QTextLayout *)in_stack_ffffffffffffff28);
  iVar1 = QTextLayout::preeditAreaPosition((QTextLayout *)0x79a3ba);
  QTextLayout::preeditAreaText((QTextLayout *)in_stack_ffffffffffffff28);
  qVar4 = QString::size(&local_50);
  iVar2 = (int)qVar4;
  QString::~QString((QString *)0x79a3ee);
  if (iVar2 == 0) {
    local_69 = QList<QTextLayout::FormatRange>::isEmpty((QList<QTextLayout::FormatRange> *)0x79a45b)
    ;
    local_69 = !local_69;
    if (local_69) {
      QList<QTextLayout::FormatRange>::clear
                ((QList<QTextLayout::FormatRange> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
  }
  else {
    qVar4 = QList<QTextLayout::FormatRange>::
            removeIf<QSyntaxHighlighterPrivate::applyFormatChanges()::__0>
                      ((QList<QTextLayout::FormatRange> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff38);
    local_69 = 0 < qVar4;
  }
  local_84 = 0;
  do {
    qVar4 = QList<QTextCharFormat>::size((QList<QTextCharFormat> *)(in_RDI + 0x88));
    if (qVar4 <= local_84) break;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::FormatRange::FormatRange((FormatRange *)0x79a4e1);
    while( true ) {
      qVar4 = QList<QTextCharFormat>::size((QList<QTextCharFormat> *)(in_RDI + 0x88));
      local_a1 = false;
      if (local_84 < qVar4) {
        QList<QTextCharFormat>::at
                  ((QList<QTextCharFormat> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (qsizetype)in_stack_ffffffffffffff28);
        local_a1 = QTextFormat::operator==
                             ((QTextFormat *)in_stack_ffffffffffffff38,
                              (QTextFormat *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      if (local_a1 == false) break;
      local_84 = local_84 + 1;
    }
    qVar4 = QList<QTextCharFormat>::size((QList<QTextCharFormat> *)(in_RDI + 0x88));
    if (local_84 == qVar4) {
      local_88 = 3;
    }
    else {
      local_20 = (undefined1 *)CONCAT44(local_20._4_4_,local_84);
      QList<QTextCharFormat>::at
                ((QList<QTextCharFormat> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (qsizetype)in_stack_ffffffffffffff28);
      QTextCharFormat::operator=
                ((QTextCharFormat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (QTextCharFormat *)in_stack_ffffffffffffff28);
      while( true ) {
        in_stack_ffffffffffffff38 = (anon_class_8_2_b718747f_for__M_pred)(long)local_84;
        qVar4 = QList<QTextCharFormat>::size((QList<QTextCharFormat> *)(in_RDI + 0x88));
        in_stack_ffffffffffffff47 = false;
        if ((long)in_stack_ffffffffffffff38 < qVar4) {
          QList<QTextCharFormat>::at
                    ((QList<QTextCharFormat> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (qsizetype)in_stack_ffffffffffffff28);
          in_stack_ffffffffffffff47 =
               QTextFormat::operator==
                         ((QTextFormat *)in_stack_ffffffffffffff38,
                          (QTextFormat *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        }
        if ((bool)in_stack_ffffffffffffff47 == false) break;
        local_84 = local_84 + 1;
      }
      iVar3 = local_84 - (int)local_20;
      local_20 = (undefined1 *)CONCAT44(iVar3,(int)local_20);
      if (iVar2 != 0) {
        if ((int)local_20 < iVar1) {
          if (iVar1 <= (int)local_20 + iVar3) {
            local_20 = (undefined1 *)CONCAT44(iVar2 + iVar3,(int)local_20);
          }
        }
        else {
          local_20 = (undefined1 *)CONCAT44(iVar3,iVar2 + (int)local_20);
        }
      }
      QList<QTextLayout::FormatRange>::operator<<
                ((QList<QTextLayout::FormatRange> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      local_69 = true;
      local_88 = 0;
    }
    QTextLayout::FormatRange::~FormatRange((FormatRange *)0x79a6c4);
  } while (local_88 == 0);
  if (local_69) {
    QTextLayout::setFormats
              ((QTextLayout *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (QList<QTextLayout::FormatRange> *)in_stack_ffffffffffffff38);
    this_00 = (QTextBlock *)QPointer<QTextDocument>::operator->((QPointer<QTextDocument> *)0x79a6fc)
    ;
    iVar1 = QTextBlock::position(this_00);
    QTextBlock::length(this_00);
    QTextDocument::markContentsDirty
              ((QTextDocument *)CONCAT44(iVar1,in_stack_ffffffffffffff30),
               (int)((ulong)this_00 >> 0x20),(int)this_00);
  }
  QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x79a742);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighterPrivate::applyFormatChanges()
{
    bool formatsChanged = false;

    QTextLayout *layout = currentBlock.layout();

    QList<QTextLayout::FormatRange> ranges = layout->formats();

    const int preeditAreaStart = layout->preeditAreaPosition();
    const int preeditAreaLength = layout->preeditAreaText().size();

    if (preeditAreaLength != 0) {
        auto isOutsidePreeditArea = [=](const QTextLayout::FormatRange &range) {
            return range.start < preeditAreaStart
                    || range.start + range.length > preeditAreaStart + preeditAreaLength;
        };
        if (ranges.removeIf(isOutsidePreeditArea) > 0)
            formatsChanged = true;
    } else if (!ranges.isEmpty()) {
        ranges.clear();
        formatsChanged = true;
    }

    int i = 0;
    while (i < formatChanges.size()) {
        QTextLayout::FormatRange r;

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        if (i == formatChanges.size())
            break;

        r.start = i;
        r.format = formatChanges.at(i);

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        Q_ASSERT(i <= formatChanges.size());
        r.length = i - r.start;

        if (preeditAreaLength != 0) {
            if (r.start >= preeditAreaStart)
                r.start += preeditAreaLength;
            else if (r.start + r.length >= preeditAreaStart)
                r.length += preeditAreaLength;
        }

        ranges << r;
        formatsChanged = true;
    }

    if (formatsChanged) {
        layout->setFormats(ranges);
        doc->markContentsDirty(currentBlock.position(), currentBlock.length());
    }
}